

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerErrors_Test::TestBody
          (Sampler_testProbabilisticSamplerErrors_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ProbabilisticSampler sampler;
  int local_a0 [2];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_98;
  ProbabilisticSampler local_78;
  ProbabilisticSampler local_48;
  
  ProbabilisticSampler::ProbabilisticSampler(&local_48,-0.1);
  local_a0[0] = 0;
  local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._samplingRate;
  testing::internal::CmpHelperLE<int,double>
            ((internal *)&local_78,"0","sampler.samplingRate()",local_a0,(double *)&local_98);
  if ((char)local_78.super_Sampler._vptr_Sampler == '\0') {
    testing::Message::Message((Message *)&local_98);
    if ((pointer)local_78._samplingRate == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (((string *)local_78._samplingRate)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') &&
         (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_98.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
      local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78._samplingRate,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78._samplingRate,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a0[0] = 1;
    local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48._samplingRate;
    testing::internal::CmpHelperGE<int,double>
              ((internal *)&local_78,"1","sampler.samplingRate()",local_a0,(double *)&local_98);
    if ((char)local_78.super_Sampler._vptr_Sampler == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((pointer)local_78._samplingRate == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (((string *)local_78._samplingRate)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x6a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
      if (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') &&
           (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          (**(code **)(((local_98.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
        }
        local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_78._samplingRate,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_78._samplingRate,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ProbabilisticSampler::ProbabilisticSampler(&local_78,1.1);
      local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_48._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_48._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48._samplingRate = local_78._samplingRate;
      local_48._samplingBoundary = local_78._samplingBoundary;
      local_48._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_78._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_98);
      local_78.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_00210cc8;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_78._tags)
      ;
      local_a0[0] = 0;
      local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_48._samplingRate;
      testing::internal::CmpHelperLE<int,double>
                ((internal *)&local_78,"0","sampler.samplingRate()",local_a0,(double *)&local_98);
      if ((char)local_78.super_Sampler._vptr_Sampler == '\0') {
        testing::Message::Message((Message *)&local_98);
        if ((pointer)local_78._samplingRate == (pointer)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (((string *)local_78._samplingRate)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x6c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
        if (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') &&
             (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
            (**(code **)(((local_98.
                           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))
                      ();
          }
          local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_78._samplingRate,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_78._samplingRate,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_a0[0] = 1;
        local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)local_48._samplingRate;
        testing::internal::CmpHelperGE<int,double>
                  ((internal *)&local_78,"1","sampler.samplingRate()",local_a0,(double *)&local_98);
        if ((char)local_78.super_Sampler._vptr_Sampler == '\0') {
          testing::Message::Message((Message *)&local_98);
          if ((pointer)local_78._samplingRate == (pointer)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = (((string *)local_78._samplingRate)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x6d,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
          if (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            cVar1 = testing::internal::IsTrue(true);
            if ((cVar1 != '\0') &&
               (local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              (**(code **)(((local_98.
                             super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8)
              )();
            }
            local_98.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_78._samplingRate,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  local_48.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_00210cc8;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_48._tags);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerErrors)
{
    ProbabilisticSampler sampler(-0.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
    sampler = ProbabilisticSampler(1.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
}